

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandPrintConstr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Scl_Con_t *p;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  p = (Scl_Con_t *)pAbc->pAbcCon;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    iVar2 = 0;
    if (p != (Scl_Con_t *)0x0) {
      Scl_ConWrite(p,(char *)0x0);
    }
  }
  else {
    fwrite("usage: print_constr [-vh] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         prints current timing constraints\n",0x2c,1,(FILE *)pAbc->Err);
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar3);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\t<file> : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Scl_CommandPrintConstr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Scl_Con_t * pCon = Scl_ConGetMan( pAbc );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    //printf( "Primary input driving cell = %s\n", Abc_FrameReadDrivingCell() );
    //printf( "Primary output maximum load = %f\n", Abc_FrameReadMaxLoad() );

    if ( pCon ) Scl_ConWrite( pCon, NULL );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: print_constr [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t         prints current timing constraints\n" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}